

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_equalobj(lua_State *L,TValue *t1,TValue *t2)

{
  short sVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  bool local_f2;
  bool local_f1;
  TValue *local_e8;
  TValue *local_e0;
  TValue *local_d8;
  TValue *local_d0;
  TValue *local_b8;
  TValue *local_b0;
  TValue *local_a8;
  TValue *local_a0;
  bool local_41;
  GCObject *local_40;
  lua_Integer i2;
  lua_Integer i1;
  TValue *tm;
  TValue *t2_local;
  TValue *t1_local;
  lua_State *L_local;
  
  tm = t2;
  t2_local = t1;
  t1_local = (TValue *)L;
  if ((t1->tt_ & 0x7f) != (t2->tt_ & 0x7f)) {
    if (((t1->tt_ & 0xf) != (t2->tt_ & 0xf)) || ((t1->tt_ & 0xf) != 3)) {
      return 0;
    }
    if (t1->tt_ == 0x13) {
      if (t1->tt_ != 0x13) {
        __assert_fail("((((t1))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2e3,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      i2 = (t1->value_).i;
    }
    else {
      iVar4 = luaV_tointegerns(t1,&i2,F2Ieq);
      local_41 = false;
      if (iVar4 == 0) goto LAB_0013fa9a;
    }
    if (tm->tt_ == 0x13) {
      if (tm->tt_ != 0x13) {
        __assert_fail("((((t2))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2e3,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      local_40 = (tm->value_).gc;
    }
    else {
      iVar4 = luaV_tointegerns(tm,(lua_Integer *)&local_40,F2Ieq);
      local_41 = false;
      if (iVar4 == 0) goto LAB_0013fa9a;
    }
    local_41 = (GCObject *)i2 == local_40;
LAB_0013fa9a:
    return (uint)local_41;
  }
  switch(t1->tt_ & 0x7f) {
  case 0:
    L_local._4_4_ = 1;
    break;
  case 1:
    if (t1->tt_ != 1) {
      __assert_fail("((((t1))->tt_) == (1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2eb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 1) {
      __assert_fail("((((t2))->tt_) == (1))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2eb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).b == (t2->value_).b);
    break;
  case 2:
    if (t1->tt_ != 2) {
      __assert_fail("((((t1))->tt_) == (2))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ec,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 2) {
      __assert_fail("((((t2))->tt_) == (2))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ec,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 3:
    if (t1->tt_ != 3) {
      __assert_fail("((((t1))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ea,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 3) {
      __assert_fail("((((t2))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ea,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).n == (t2->value_).n);
    break;
  case 4:
    if ((t1->tt_ & 0xf) != 4) {
      __assert_fail("(((((((t1))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t1->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((t1)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t1->value_).gc)->tt != '\x04') {
      __assert_fail("((((void) sizeof (((((((((t1))->tt_)) & 0x0F)) == (4))) ? 1 : 0), __extension__ ({ if ((((((((t1))->tt_)) & 0x0F)) == (4))) ; else __assert_fail (\"(((((((t1))->tt_)) & 0x0F)) == (4))\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), ((((void) sizeof (((((((t1)->value_).gc)->tt) & 0x0F) == 4) ? 1 : 0), __extension__ ({ if ((((((t1)->value_).gc)->tt) & 0x0F) == 4) ; else __assert_fail (\"(((((t1)->value_).gc)->tt) & 0x0F) == 4\", \"/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c\", 751, __extension__ __PRETTY_FUNCTION__); })), (&((((union GCUnion *)((((t1)->value_).gc))))->ts))))))->tt == ((4) | ((0) << 4))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t1->tt_ & 0xf) != 4) {
      __assert_fail("(((((((t1))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t1->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((t1)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->tt_ & 0xf) != 4) {
      __assert_fail("(((((((t2))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t2->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((t2)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ef,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 5:
    if (t1->tt_ != 0x8005) {
      __assert_fail("((((t1))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t1->value_).gc)->tt != '\x05') {
      __assert_fail("(((t1)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 0x8005) {
      __assert_fail("((((t2))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t2->value_).gc)->tt != '\x05') {
      __assert_fail("(((t2)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ff,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (t1->tt_ != 0x8005) {
      __assert_fail("((((t1))->tt_) == (((5) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t1->value_).gc)->tt != '\x05') {
      __assert_fail("(((t1)->value_).gc)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (*(long *)((t1->value_).f + 0x28) == 0) {
      local_d0 = (TValue *)0x0;
    }
    else {
      if (t1->tt_ != 0x8005) {
        __assert_fail("((((t1))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (((t1->value_).gc)->tt != '\x05') {
        __assert_fail("(((t1)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if ((*(byte *)(*(long *)((t1->value_).f + 0x28) + 10) & 0x20) == 0) {
        if (t1->tt_ != 0x8005) {
          __assert_fail("((((t1))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if (((t1->value_).gc)->tt != '\x05') {
          __assert_fail("(((t1)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x301,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        local_d8 = luaT_gettm(*(Table **)((t1->value_).f + 0x28),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_d8 = (TValue *)0x0;
      }
      local_d0 = local_d8;
    }
    i1 = (lua_Integer)local_d0;
    if (local_d0 == (TValue *)0x0) {
      if (tm->tt_ != 0x8005) {
        __assert_fail("((((t2))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (((tm->value_).gc)->tt != '\x05') {
        __assert_fail("(((t2)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (*(long *)((tm->value_).f + 0x28) == 0) {
        local_e0 = (TValue *)0x0;
      }
      else {
        if (tm->tt_ != 0x8005) {
          __assert_fail("((((t2))->tt_) == (((5) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if (((tm->value_).gc)->tt != '\x05') {
          __assert_fail("(((t2)->value_).gc)->tt == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if ((*(byte *)(*(long *)((tm->value_).f + 0x28) + 10) & 0x20) == 0) {
          if (tm->tt_ != 0x8005) {
            __assert_fail("((((t2))->tt_) == (((5) | (1 << 15))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
          }
          if (((tm->value_).gc)->tt != '\x05') {
            __assert_fail("(((t2)->value_).gc)->tt == 5",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x303,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
          }
          local_e8 = luaT_gettm(*(Table **)((tm->value_).f + 0x28),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x138));
        }
        else {
          local_e8 = (TValue *)0x0;
        }
        local_e0 = local_e8;
      }
      i1 = (lua_Integer)local_e0;
    }
    goto LAB_00140afe;
  default:
    if ((t1->tt_ & 0x8000) == 0) {
      __assert_fail("(((t1)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x307,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->tt_ & 0x8000) == 0) {
      __assert_fail("(((t2)->tt_) & (1 << 15))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x307,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 7:
    if (t1->tt_ != 0x8007) {
      __assert_fail("((((t1))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t1->value_).gc)->tt != '\a') {
      __assert_fail("(((t1)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 0x8007) {
      __assert_fail("((((t2))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t2->value_).gc)->tt != '\a') {
      __assert_fail("(((t2)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f2,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t1->value_).gc == (t2->value_).gc) {
      return 1;
    }
    if (L == (lua_State *)0x0) {
      return 0;
    }
    if (t1->tt_ != 0x8007) {
      __assert_fail("((((t1))->tt_) == (((7) | (1 << 15))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (((t1->value_).gc)->tt != '\a') {
      __assert_fail("(((t1)->value_).gc)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (*(long *)((t1->value_).f + 0x10) == 0) {
      local_a0 = (TValue *)0x0;
    }
    else {
      if (t1->tt_ != 0x8007) {
        __assert_fail("((((t1))->tt_) == (((7) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (((t1->value_).gc)->tt != '\a') {
        __assert_fail("(((t1)->value_).gc)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if ((*(byte *)(*(long *)((t1->value_).f + 0x10) + 10) & 0x20) == 0) {
        if (t1->tt_ != 0x8007) {
          __assert_fail("((((t1))->tt_) == (((7) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if (((t1->value_).gc)->tt != '\a') {
          __assert_fail("(((t1)->value_).gc)->tt == 7",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2f4,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        local_a8 = luaT_gettm(*(Table **)((t1->value_).f + 0x10),TM_EQ,L->l_G->tmname[5]);
      }
      else {
        local_a8 = (TValue *)0x0;
      }
      local_a0 = local_a8;
    }
    i1 = (lua_Integer)local_a0;
    if (local_a0 == (TValue *)0x0) {
      if (tm->tt_ != 0x8007) {
        __assert_fail("((((t2))->tt_) == (((7) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (((tm->value_).gc)->tt != '\a') {
        __assert_fail("(((t2)->value_).gc)->tt == 7",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
      }
      if (*(long *)((tm->value_).f + 0x10) == 0) {
        local_b0 = (TValue *)0x0;
      }
      else {
        if (tm->tt_ != 0x8007) {
          __assert_fail("((((t2))->tt_) == (((7) | (1 << 15))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if (((tm->value_).gc)->tt != '\a') {
          __assert_fail("(((t2)->value_).gc)->tt == 7",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
        }
        if ((*(byte *)(*(long *)((tm->value_).f + 0x10) + 10) & 0x20) == 0) {
          if (tm->tt_ != 0x8007) {
            __assert_fail("((((t2))->tt_) == (((7) | (1 << 15))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
          }
          if (((tm->value_).gc)->tt != '\a') {
            __assert_fail("(((t2)->value_).gc)->tt == 7",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x2f6,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
          }
          local_b8 = luaT_gettm(*(Table **)((tm->value_).f + 0x10),TM_EQ,
                                *(TString **)(*(long *)&t1_local[1].tt_ + 0x138));
        }
        else {
          local_b8 = (TValue *)0x0;
        }
        local_b0 = local_b8;
      }
      i1 = (lua_Integer)local_b0;
    }
LAB_00140afe:
    if (i1 == 0) {
      L_local._4_4_ = 0;
    }
    else {
      luaT_callTM((lua_State *)t1_local,(TValue *)i1,t2_local,tm,(TValue *)t1_local[1].value_.gc,1);
      sVar1._0_1_ = (t1_local[1].value_.gc)->tt;
      sVar1._1_1_ = (t1_local[1].value_.gc)->marked;
      local_f1 = true;
      if (sVar1 != 0) {
        sVar2._0_1_ = (t1_local[1].value_.gc)->tt;
        sVar2._1_1_ = (t1_local[1].value_.gc)->marked;
        local_f2 = false;
        if (sVar2 == 1) {
          sVar3._0_1_ = (t1_local[1].value_.gc)->tt;
          sVar3._1_1_ = (t1_local[1].value_.gc)->marked;
          if (sVar3 != 1) {
            __assert_fail("((((L->top))->tt_) == (1))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x30c,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
          }
          local_f2 = *(int *)&(t1_local[1].value_.gc)->next == 0;
        }
        local_f1 = local_f2;
      }
      L_local._4_4_ = (uint)((local_f1 ^ 0xffU) & 1);
    }
    break;
  case 0x13:
    if (t1->tt_ != 0x13) {
      __assert_fail("((((t1))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2e9,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 0x13) {
      __assert_fail("((((t2))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2e9,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 0x14:
    if ((t1->tt_ & 0xf) != 4) {
      __assert_fail("(((((((t1))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t1->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((t1)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->tt_ & 0xf) != 4) {
      __assert_fail("(((((((t2))->tt_)) & 0x0F)) == (4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t2->value_).gc)->tt & 0xf) != 4) {
      __assert_fail("(((((t2)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2f0,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = luaS_eqlngstr((TString *)(t1->value_).gc,(TString *)(t2->value_).gc);
    break;
  case 0x15:
  case 0x25:
    if ((t1->tt_ != 0x8015) && (t1->tt_ != 0x8025)) {
      __assert_fail("(((((t1))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t1))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t1->value_).gc)->tt != '\x15') && (((t1->value_).gc)->tt != '%')) {
      __assert_fail("((((t1)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t1)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->tt_ != 0x8015) && (t2->tt_ != 0x8025)) {
      __assert_fail("(((((t2))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t2))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((((t2->value_).gc)->tt != '\x15') && (((t2->value_).gc)->tt != '%')) {
      __assert_fail("((((t2)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t2)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2fb,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t1->value_).gc == (t2->value_).gc) {
      L_local._4_4_ = 1;
    }
    else {
      L_local._4_4_ = 0;
    }
    break;
  case 0x16:
    if (t1->tt_ != 0x16) {
      __assert_fail("((((t1))->tt_) == (((6) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ed,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if (t2->tt_ != 0x16) {
      __assert_fail("((((t2))->tt_) == (((6) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ed,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
    break;
  case 0x46:
    if ((t1->tt_ & 0x7f) != 0x46) {
      __assert_fail("((((t1)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ee,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    if ((t2->tt_ & 0x7f) != 0x46) {
      __assert_fail("((((t2)->tt_) & 0x7F) == ((6) | ((4) << 4)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x2ee,"int luaV_equalobj(lua_State *, const TValue *, const TValue *)");
    }
    L_local._4_4_ = (uint)((t1->value_).gc == (t2->value_).gc);
  }
  return L_local._4_4_;
}

Assistant:

int luaV_equalobj (lua_State *L, const TValue *t1, const TValue *t2) {
  const TValue *tm;
  if (ttype(t1) != ttype(t2)) {  /* not the same variant? */
    if (ttnov(t1) != ttnov(t2) || ttnov(t1) != LUA_TNUMBER)
      return 0;  /* only numbers can be equal with different variants */
    else {  /* two numbers with different variants */
      lua_Integer i1, i2;  /* compare them as integers */
      return (tointegerns(t1, &i1) && tointegerns(t2, &i2) && i1 == i2);
    }
  }
  /* values have same type and same variant */
  switch (ttype(t1)) {
    case LUA_TNIL: return 1;
    case LUA_TNUMINT: return (ivalue(t1) == ivalue(t2));
    case LUA_TNUMFLT: return luai_numeq(fltvalue(t1), fltvalue(t2));
    case LUA_TBOOLEAN: return bvalue(t1) == bvalue(t2);  /* true must be 1 !! */
    case LUA_TLIGHTUSERDATA: return pvalue(t1) == pvalue(t2);
    case LUA_TLCF: return fvalue(t1) == fvalue(t2);
	case RAVI_TFCF: return fcfvalue(t1) == fcfvalue(t2);
    case LUA_TSHRSTR: return eqshrstr(tsvalue(t1), tsvalue(t2));
    case LUA_TLNGSTR: return luaS_eqlngstr(tsvalue(t1), tsvalue(t2));
    case LUA_TUSERDATA: {
      if (uvalue(t1) == uvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, uvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, uvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    case RAVI_TIARRAY:
    case RAVI_TFARRAY: {
      if (arrvalue(t1) == arrvalue(t2)) return 1;
      else return 0;
    }
    case LUA_TTABLE: {
      if (hvalue(t1) == hvalue(t2)) return 1;
      else if (L == NULL) return 0;
      tm = fasttm(L, hvalue(t1)->metatable, TM_EQ);
      if (tm == NULL)
        tm = fasttm(L, hvalue(t2)->metatable, TM_EQ);
      break;  /* will try TM */
    }
    default:
      return gcvalue(t1) == gcvalue(t2);
  }
  if (tm == NULL)  /* no TM? */
    return 0;  /* objects are different */
  luaT_callTM(L, tm, t1, t2, L->top, 1);  /* call TM */
  return !l_isfalse(L->top);
}